

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

EncoderStatus __thiscall mp3_encoder::Encoder::encode(Encoder *this)

{
  lame_global_flags *plVar1;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  FILE *__s;
  element_type *peVar5;
  size_t sVar6;
  element_type *peVar7;
  size_t local_68;
  size_t bytesWritten;
  size_t bytesRead;
  FILE *mp3File;
  string mp3_file_path;
  FILE *wavFile;
  Encoder *this_local;
  
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->m_wavFilePath);
  mp3_file_path.field_2._8_8_ = fopen(pcVar3,"rb");
  if ((FILE *)mp3_file_path.field_2._8_8_ == (FILE *)0x0) {
    this_local._4_4_ = OpenFileError;
  }
  else {
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_of(&this->m_wavFilePath,'.',0xffffffffffffffff);
    __str = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (&this->m_wavFilePath,sVar4 + 1,3,"mp3");
    std::__cxx11::string::string((string *)&mp3File,__str);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &mp3File);
    __s = fopen(pcVar3,"wb");
    if (__s == (FILE *)0x0) {
      this_local._4_4_ = OpenFileError;
    }
    else {
      fread(&this->m_wavHeader,0x2c,1,(FILE *)mp3_file_path.field_2._8_8_);
      do {
        peVar5 = std::__shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(this->m_wavBuffer).
                             super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>);
        sVar6 = fread(peVar5,(ulong)((uint)(this->m_wavHeader).numChannels * 2),0x1000,
                      (FILE *)mp3_file_path.field_2._8_8_);
        if (sVar6 == 0) {
          plVar1 = this->m_lameFlags;
          peVar7 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                             (&(this->m_mp3Buffer).
                               super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
          iVar2 = lame_encode_flush(plVar1,peVar7,0x1000);
        }
        else if ((this->m_wavHeader).numChannels == 1) {
          plVar1 = this->m_lameFlags;
          peVar5 = std::__shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>::get
                             (&(this->m_wavBuffer).
                               super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>);
          peVar7 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                             (&(this->m_mp3Buffer).
                               super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
          iVar2 = lame_encode_buffer(plVar1,peVar5,0,sVar6 & 0xffffffff,peVar7,0x1000);
        }
        else {
          plVar1 = this->m_lameFlags;
          peVar5 = std::__shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>::get
                             (&(this->m_wavBuffer).
                               super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>);
          peVar7 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                             (&(this->m_mp3Buffer).
                               super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
          iVar2 = lame_encode_buffer_interleaved(plVar1,peVar5,sVar6 & 0xffffffff,peVar7,0x1000);
        }
        local_68 = (size_t)iVar2;
        peVar7 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(this->m_mp3Buffer).
                             super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
        fwrite(peVar7,local_68,1,__s);
      } while (sVar6 != 0);
      fclose((FILE *)mp3_file_path.field_2._8_8_);
      fclose(__s);
      this_local._4_4_ = StatusOk;
    }
    std::__cxx11::string::~string((string *)&mp3File);
  }
  return this_local._4_4_;
}

Assistant:

EncoderStatus Encoder::encode()
    {
        auto const wavFile = fopen(m_wavFilePath.c_str(), "rb");
        if(!wavFile)
        {
            return EncoderStatus::OpenFileError;
        }

        std::string mp3_file_path = m_wavFilePath.replace(m_wavFilePath.find_last_of('.') + 1, 3, "mp3");
        FILE* mp3File = fopen(mp3_file_path.c_str(), "wb");
        if(!mp3File)
        {
            return EncoderStatus::OpenFileError;
        }

        fread(&m_wavHeader, sizeof(wav_header_t), 1, wavFile);

        auto bytesRead    = std::size_t{};
        auto bytesWritten = std::size_t{};

        do
        {
            bytesRead = fread(m_wavBuffer.get(), m_wavHeader.numChannels * sizeof(short), CHUNK_SIZE, wavFile);

            if (bytesRead != 0)
            {
                if (m_wavHeader.numChannels == 1)
                {
                    bytesWritten = lame_encode_buffer(m_lameFlags, m_wavBuffer.get(), nullptr, static_cast<int>(bytesRead), m_mp3Buffer.get(), CHUNK_SIZE);
                }
                else
                {
                    bytesWritten = lame_encode_buffer_interleaved(m_lameFlags, m_wavBuffer.get(), static_cast<int>(bytesRead), m_mp3Buffer.get(), CHUNK_SIZE);
                }
            }
            else
            {
                bytesWritten = lame_encode_flush(m_lameFlags, m_mp3Buffer.get(), CHUNK_SIZE);
            }

            if (bytesWritten < 0)
            {
                fclose(wavFile);
                fclose(mp3File);
                return EncoderStatus::EncodeBufferError;
            }

            fwrite(m_mp3Buffer.get(), bytesWritten, 1, mp3File);

        } while (bytesRead != 0);

        fclose(wavFile);
        fclose(mp3File);

        return EncoderStatus::StatusOk;
    }